

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevent_fork.h
# Opt level: O1

void snmalloc::PreventFork::prefork(void)

{
  long lVar1;
  undefined *puVar2;
  long *in_FS_OFFSET;
  
  lVar1 = *in_FS_OFFSET;
  *in_FS_OFFSET = lVar1 + 1;
  if (lVar1 == 0) {
    puVar2 = (undefined *)0x0;
    if (*in_FS_OFFSET != 0) {
      prefork();
    }
    do {
    } while (((ulong)threads_preventing_fork.super___atomic_base<unsigned_long>._M_i & 1) != 0);
    threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         ((ulong)threads_preventing_fork.super___atomic_base<unsigned_long>._M_i | 1);
    LOCK();
    UNLOCK();
    do {
    } while (threads_preventing_fork.super___atomic_base<unsigned_long>._M_i != 1);
    *(long *)((long)in_FS_OFFSET + (long)puVar2) = *(long *)((long)in_FS_OFFSET + (long)puVar2) + 1;
  }
  return;
}

Assistant:

static void prefork()
    {
      if (depth_of_handlers++ != 0)
        return;

      if (depth_of_prevention != 0)
        error("Fork attempted while in PreventFork region.");

      while (true)
      {
        auto current = threads_preventing_fork.load();
        if (
          (current % 2 == 0) &&
          (threads_preventing_fork.compare_exchange_weak(current, current + 1)))
        {
          break;
        }
        Aal::pause();
      };

      while (threads_preventing_fork.load() != 1)
      {
        Aal::pause();
      }

      // Finally set the flag that allows this thread to enter PreventFork
      // regions This is safe as the only other calls here are to other prefork
      // handlers.
      depth_of_prevention++;
    }